

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

heapelement_t * yanktop(heapelement_t ***heap,int32 heapsize,int32 *newsize)

{
  int32 iVar1;
  heapelement_t *phVar2;
  heapelement_t *phVar3;
  int iVar4;
  int iVar5;
  int32 iVar6;
  heapelement_t **pphVar7;
  int32 y;
  int32 x;
  heapelement_t *tmp;
  int local_40;
  int32 newheapsize;
  int32 id;
  int32 high;
  int32 right;
  int32 left;
  heapelement_t *out;
  heapelement_t **lheap;
  int32 *newsize_local;
  int32 heapsize_local;
  heapelement_t ***heap_local;
  
  pphVar7 = *heap;
  phVar2 = *pphVar7;
  *pphVar7 = pphVar7[heapsize + -1];
  local_40 = 0;
  while (local_40 < heapsize + -1) {
    iVar4 = local_40 * 2 + 1;
    iVar5 = local_40 * 2 + 2;
    if ((heapsize + -2 < iVar5) && (heapsize + -2 < iVar4)) break;
    newheapsize = iVar4;
    if ((iVar4 != heapsize + -2) &&
       (iVar6 = compare(pphVar7[iVar5],pphVar7[iVar4]), newheapsize = iVar5, iVar6 < 0)) {
      newheapsize = iVar4;
    }
    iVar6 = compare(pphVar7[local_40],pphVar7[newheapsize]);
    if (-1 < iVar6) break;
    iVar6 = pphVar7[local_40]->heapid;
    iVar1 = pphVar7[newheapsize]->heapid;
    phVar3 = pphVar7[local_40];
    pphVar7[local_40] = pphVar7[newheapsize];
    pphVar7[newheapsize] = phVar3;
    pphVar7[local_40]->heapid = iVar6;
    pphVar7[newheapsize]->heapid = iVar1;
    local_40 = newheapsize;
  }
  *newsize = heapsize + -1;
  pphVar7 = (heapelement_t **)realloc(pphVar7,(long)(heapsize + -1) << 3);
  *heap = pphVar7;
  return phVar2;
}

Assistant:

heapelement_t *yanktop(heapelement_t ***heap, int32 heapsize, int32 *newsize)
{
    heapelement_t **lheap,*out;
    int32 left,right,high,id = 0,newheapsize;

    lheap = *heap;
    out = lheap[0];

    lheap[0] = lheap[heapsize-1];
    id = 0;
    while (id < heapsize-1) {
        left = LEFTCHILD(id);
        right = RIGHTCHILD(id);
        if (right > heapsize-2 && left > heapsize-2) break;
        if (left == heapsize-2) high = left;
        else {
            if (compare(lheap[right],lheap[left]) < 0) high = left;
            else high = right; 
        }
        if (compare(lheap[id],lheap[high]) < 0){
            SWAP(lheap[id],lheap[high]);
            id = high;
        }
        else break;
    }

    *newsize = newheapsize = heapsize-1;
    *heap = (heapelement_t**) realloc(lheap,newheapsize*sizeof(heapelement_t*));

    return(out);
}